

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

Bac_Ntk_t * Bac_ManRoot(Bac_Man_t *p)

{
  Bac_Ntk_t *pBVar1;
  Bac_Man_t *p_local;
  
  pBVar1 = Bac_ManNtk(p,p->iRoot);
  return pBVar1;
}

Assistant:

static inline Bac_Ntk_t *    Bac_ManRoot( Bac_Man_t * p )                    { return Bac_ManNtk(p, p->iRoot);                                                             }